

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_rootindexproxymodel.cpp
# Opt level: O2

void __thiscall tst_RootIndexProxyModel::replaceModel_data(tst_RootIndexProxyModel *this)

{
  QAbstractItemModel *pQVar1;
  QTestData *pQVar2;
  QAbstractItemModel *replaceModel;
  QAbstractItemModel *baseModel;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  QModelIndex local_90;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  QModelIndex local_60;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  QTest::addColumn<QAbstractItemModel*>("baseModel",(QAbstractItemModel **)0x0);
  QTest::addColumnInternal(0x2a,"baseRoot");
  QTest::addColumn<QAbstractItemModel*>("replaceModel",(QAbstractItemModel **)0x0);
  QTest::addColumnInternal(0x2a,"replaceRoot");
  baseModel = createTreeModel(&this->super_QObject);
  replaceModel = createTreeModel(&this->super_QObject);
  pQVar2 = (QTestData *)QTest::newRow("Child");
  pQVar2 = operator<<(pQVar2,&baseModel);
  local_78 = 0xffffffffffffffff;
  local_70 = 0;
  uStack_68 = 0;
  (**(code **)(*(long *)baseModel + 0x60))(&local_60,baseModel,1,0,&local_78);
  pQVar2 = operator<<(pQVar2,&local_60);
  pQVar2 = operator<<(pQVar2,&replaceModel);
  local_a8 = 0xffffffffffffffff;
  local_a0 = 0;
  uStack_98 = 0;
  (**(code **)(*(long *)replaceModel + 0x60))(&local_90,replaceModel,0,0);
  operator<<(pQVar2,&local_90);
  baseModel = createTreeModel(&this->super_QObject);
  replaceModel = createTreeModel(&this->super_QObject);
  pQVar2 = (QTestData *)QTest::newRow("Grandchild");
  pQVar2 = operator<<(pQVar2,&baseModel);
  local_78 = 0xffffffffffffffff;
  local_70 = 0;
  uStack_68 = 0;
  (**(code **)(*(long *)baseModel + 0x60))(&local_60,baseModel,1,0,&local_78);
  pQVar2 = operator<<(pQVar2,&local_60);
  pQVar2 = operator<<(pQVar2,&replaceModel);
  pQVar1 = replaceModel;
  local_48 = 0xffffffffffffffff;
  local_40 = 0;
  uStack_38 = 0;
  (**(code **)(*(long *)replaceModel + 0x60))(&local_a8,replaceModel,1,0);
  (**(code **)(*(long *)pQVar1 + 0x60))(&local_90,pQVar1,2,0,&local_a8);
  operator<<(pQVar2,&local_90);
  return;
}

Assistant:

void tst_RootIndexProxyModel::replaceModel_data()
{
#ifdef COMPLEX_MODEL_SUPPORT
    QTest::addColumn<QAbstractItemModel *>("baseModel");
    QTest::addColumn<QModelIndex>("baseRoot");
    QTest::addColumn<QAbstractItemModel *>("replaceModel");
    QTest::addColumn<QModelIndex>("replaceRoot");

    QAbstractItemModel *baseModel = createTreeModel(this);
    QAbstractItemModel *replaceModel = createTreeModel(this);
    QTest::newRow("Child") << baseModel << baseModel->index(1, 0) << replaceModel << replaceModel->index(0, 0);
    baseModel = createTreeModel(this);
    replaceModel = createTreeModel(this);
    QTest::newRow("Grandchild") << baseModel << baseModel->index(1, 0) << replaceModel << replaceModel->index(2, 0, replaceModel->index(1, 0));
#else
    QSKIP("This test requires the Qt GUI or GenericModel modules");
#endif
}